

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O1

void __thiscall testing::internal::UnitTestImpl::PostFlagParsingInit(UnitTestImpl *this)

{
  InternalRunDeathTestFlag *p;
  pointer ppPVar1;
  
  if (this->post_flag_parse_init_performed_ != false) {
    return;
  }
  this->post_flag_parse_init_performed_ = true;
  p = ParseInternalRunDeathTestFlag();
  scoped_ptr<testing::internal::InternalRunDeathTestFlag>::reset
            (&this->internal_run_death_test_flag_,p);
  if ((this->internal_run_death_test_flag_).ptr_ != (InternalRunDeathTestFlag *)0x0) {
    ((this->listeners_).repeater_)->forwarding_enabled_ = false;
  }
  if (this->parameterized_tests_registered_ == false) {
    for (ppPVar1 = (this->parameterized_test_registry_).test_case_infos_.
                   super__Vector_base<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppPVar1 !=
        (this->parameterized_test_registry_).test_case_infos_.
        super__Vector_base<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>
        ._M_impl.super__Vector_impl_data._M_finish; ppPVar1 = ppPVar1 + 1) {
      (*(*ppPVar1)->_vptr_ParameterizedTestCaseInfoBase[4])();
    }
    this->parameterized_tests_registered_ = true;
  }
  ConfigureXmlOutput(this);
  ConfigureStreamingOutput(this);
  return;
}

Assistant:

void UnitTestImpl::PostFlagParsingInit() {
  // Ensures that this function does not execute more than once.
  if (!post_flag_parse_init_performed_) {
    post_flag_parse_init_performed_ = true;

#if GTEST_HAS_DEATH_TEST
    InitDeathTestSubprocessControlInfo();
    SuppressTestEventsIfInSubprocess();
#endif  // GTEST_HAS_DEATH_TEST

    // Registers parameterized tests. This makes parameterized tests
    // available to the UnitTest reflection API without running
    // RUN_ALL_TESTS.
    RegisterParameterizedTests();

    // Configures listeners for XML output. This makes it possible for users
    // to shut down the default XML output before invoking RUN_ALL_TESTS.
    ConfigureXmlOutput();

#if GTEST_CAN_STREAM_RESULTS_
    // Configures listeners for streaming test results to the specified server.
    ConfigureStreamingOutput();
#endif  // GTEST_CAN_STREAM_RESULTS_
  }
}